

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *info;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uchar *puVar7;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  uchar *out_00;
  uint uVar10;
  uint uVar12;
  size_t bytewidth;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  ulong local_288;
  ulong local_250;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t local_138 [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  int iVar11;
  
  uVar14 = (ulong)(info_png->color).colortype;
  iVar11 = 0;
  if (uVar14 < 7) {
    iVar11 = *(int *)(&DAT_00a3d184 + uVar14 * 4);
  }
  uVar10 = iVar11 * (info_png->color).bitdepth;
  info = &info_png->color;
  if (info_png->interlace_method == 0) {
    uVar12 = uVar10 * w;
    uVar19 = (uVar12 + 7 >> 3) * h;
    uVar18 = uVar19 + h;
    *outsize = (ulong)uVar18;
    puVar7 = (uchar *)malloc((ulong)uVar18);
    *out = puVar7;
    uVar6 = (uint)CONCAT71((int7)((ulong)out >> 8),puVar7 == (uchar *)0x0);
    if (uVar18 == 0 || puVar7 != (uchar *)0x0) {
      if ((uVar10 < 8) && (uVar10 = uVar12 + 7 & 0xfffffff8, uVar12 != uVar10)) {
        out_00 = (uchar *)malloc((ulong)uVar19);
        if (out_00 != (uchar *)0x0) {
          addPaddingBits(out_00,in,(ulong)uVar10,(ulong)uVar12,h);
          filter(puVar7,out_00,w,h,info,settings);
        }
        free(out_00);
        return extraout_EAX_00;
      }
      uVar10 = filter(puVar7,in,w,h,info,settings);
      return uVar10;
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar10);
    *outsize = filter_passstart[7];
    puVar7 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar7;
    __ptr = malloc(passstart[7]);
    if ((puVar7 != (uchar *)0x0) && (passstart[7] == 0 || __ptr != (void *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_138,w,h,uVar10
                         );
      if (uVar10 < 8) {
        lVar8 = 0;
        do {
          uVar6 = passh_1[lVar8];
          if (uVar6 != 0) {
            uVar12 = passw_1[lVar8];
            uVar18 = 0;
            do {
              if ((ulong)uVar12 != 0) {
                uVar19 = ADAM7_DY[lVar8];
                uVar2 = ADAM7_IY[lVar8];
                uVar3 = ADAM7_DX[lVar8];
                sVar5 = local_138[lVar8];
                uVar4 = ADAM7_IX[lVar8];
                uVar14 = 0;
                do {
                  if (uVar10 != 0) {
                    uVar13 = (ulong)((uVar12 * uVar18 + (int)uVar14) * uVar10) + sVar5 * 8;
                    uVar9 = (ulong)((uVar3 * (int)uVar14 + (uVar19 * uVar18 + uVar2) * w + uVar4) *
                                   uVar10);
                    uVar15 = uVar10;
                    do {
                      bVar17 = '\x01' << (~(byte)uVar13 & 7);
                      if ((in[uVar9 >> 3] >> (~(byte)uVar9 & 7) & 1) == 0) {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 & ~bVar17;
                      }
                      else {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 | bVar17;
                      }
                      uVar13 = uVar13 + 1;
                      uVar9 = uVar9 + 1;
                      uVar15 = uVar15 - 1;
                    } while (uVar15 != 0);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar12);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar6);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else {
        uVar14 = (ulong)(uVar10 >> 3);
        lVar8 = 0;
        do {
          uVar6 = passh_1[lVar8];
          if ((ulong)uVar6 != 0) {
            uVar9 = (ulong)passw_1[lVar8];
            local_250 = 0;
            local_288 = 0;
            do {
              if (uVar9 != 0) {
                uVar12 = ADAM7_DX[lVar8];
                sVar5 = local_138[lVar8];
                uVar18 = (ADAM7_DY[lVar8] * (int)local_288 + ADAM7_IY[lVar8]) * w + ADAM7_IX[lVar8];
                uVar13 = uVar9;
                uVar16 = local_250;
                do {
                  memcpy((void *)((long)__ptr + (uVar16 & 0xffffffff) * uVar14 + sVar5),
                         in + uVar18 * uVar14,uVar14);
                  uVar18 = uVar18 + uVar12;
                  uVar16 = uVar16 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              local_288 = local_288 + 1;
              local_250 = local_250 + uVar9;
            } while (local_288 != uVar6);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      lVar8 = 0;
      do {
        if (uVar10 < 8) {
          puVar7 = (uchar *)malloc(*(long *)((long)padded_passstart + lVar8 * 2 + 8) -
                                   *(long *)((long)padded_passstart + lVar8 * 2));
          if (puVar7 == (uchar *)0x0) break;
          uVar6 = *(uint *)((long)passw + lVar8);
          uVar18 = uVar6 * uVar10;
          uVar12 = *(uint *)((long)passh + lVar8);
          addPaddingBits(puVar7,(uchar *)(*(long *)((long)passstart + lVar8 * 2) + (long)__ptr),
                         (ulong)(uVar18 + 7 & 0xfffffff8),(ulong)uVar18,uVar12);
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar8 * 2),puVar7,uVar6,uVar12,
                         info,settings);
          free(puVar7);
        }
        else {
          uVar6 = filter(*out + *(long *)((long)filter_passstart + lVar8 * 2),
                         (uchar *)(*(long *)((long)padded_passstart + lVar8 * 2) + (long)__ptr),
                         *(uint *)((long)passw + lVar8),*(uint *)((long)passh + lVar8),info,settings
                        );
        }
        if ((uVar6 != 0) || (bVar20 = lVar8 == 0x18, lVar8 = lVar8 + 4, bVar20)) break;
      } while( true );
    }
    free(__ptr);
    uVar6 = extraout_EAX;
  }
  return uVar6;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0)
  {
    *outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error)
    {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
      {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
        if(!padded) error = 83; /*alloc fail*/
        if(!error)
        {
          addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else
      {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error)
    {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i)
      {
        if(bpp < 8)
        {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else
        {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}